

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonBlobChangePayloadSize(JsonParse *pParse,u32 i,u32 szPayload)

{
  byte bVar1;
  byte bVar2;
  uint N;
  int iVar3;
  u32 newSize;
  int delta;
  u8 nNeeded;
  u8 nExtra;
  u8 szType;
  u8 *a;
  u32 szPayload_local;
  u32 i_local;
  JsonParse *pParse_local;
  
  if (pParse->oom == '\0') {
    _delta = pParse->aBlob + i;
    bVar1 = (byte)((int)(uint)*_delta >> 4);
    if (bVar1 < 0xc) {
      newSize._2_1_ = 0;
    }
    else if (bVar1 == 0xc) {
      newSize._2_1_ = 1;
    }
    else if (bVar1 == 0xd) {
      newSize._2_1_ = 2;
    }
    else {
      newSize._2_1_ = 4;
    }
    if (szPayload < 0xc) {
      newSize._1_1_ = 0;
    }
    else if (szPayload < 0x100) {
      newSize._1_1_ = 1;
    }
    else if (szPayload < 0x10000) {
      newSize._1_1_ = 2;
    }
    else {
      newSize._1_1_ = 4;
    }
    pParse_local._4_4_ = (uint)newSize._1_1_ - (uint)newSize._2_1_;
    if (pParse_local._4_4_ != 0) {
      N = pParse->nBlob + pParse_local._4_4_;
      if (pParse_local._4_4_ < 1) {
        memmove(_delta + 1,_delta + (1 - pParse_local._4_4_),
                (ulong)(pParse->nBlob - ((i + 1) - pParse_local._4_4_)));
      }
      else {
        if ((pParse->nBlobAlloc < N) && (iVar3 = jsonBlobExpand(pParse,N), iVar3 != 0)) {
          return 0;
        }
        _delta = pParse->aBlob + i;
        memmove(_delta + (pParse_local._4_4_ + 1),_delta + 1,(ulong)(pParse->nBlob - (i + 1)));
      }
      pParse->nBlob = N;
    }
    if (newSize._1_1_ == 0) {
      *_delta = *_delta & 0xf | (byte)(szPayload << 4);
    }
    else {
      bVar1 = (byte)szPayload;
      if (newSize._1_1_ == 1) {
        *_delta = *_delta & 0xf | 0xc0;
        _delta[1] = bVar1;
      }
      else {
        bVar2 = (byte)(szPayload >> 8);
        if (newSize._1_1_ == 2) {
          *_delta = *_delta & 0xf | 0xd0;
          _delta[1] = bVar2;
          _delta[2] = bVar1;
        }
        else {
          *_delta = *_delta & 0xf | 0xe0;
          _delta[1] = (byte)(szPayload >> 0x18);
          _delta[2] = (byte)(szPayload >> 0x10);
          _delta[3] = bVar2;
          _delta[4] = bVar1;
        }
      }
    }
  }
  else {
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

static int jsonBlobChangePayloadSize(
  JsonParse *pParse,
  u32 i,
  u32 szPayload
){
  u8 *a;
  u8 szType;
  u8 nExtra;
  u8 nNeeded;
  int delta;
  if( pParse->oom ) return 0;
  a = &pParse->aBlob[i];
  szType = a[0]>>4;
  if( szType<=11 ){
    nExtra = 0;
  }else if( szType==12 ){
    nExtra = 1;
  }else if( szType==13 ){
    nExtra = 2;
  }else{
    nExtra = 4;
  }
  if( szPayload<=11 ){
    nNeeded = 0;
  }else if( szPayload<=0xff ){
    nNeeded = 1;
  }else if( szPayload<=0xffff ){
    nNeeded = 2;
  }else{
    nNeeded = 4;
  }
  delta = nNeeded - nExtra;
  if( delta ){
    u32 newSize = pParse->nBlob + delta;
    if( delta>0 ){
      if( newSize>pParse->nBlobAlloc && jsonBlobExpand(pParse, newSize) ){
        return 0;  /* OOM error.  Error state recorded in pParse->oom. */
      }
      a = &pParse->aBlob[i];
      memmove(&a[1+delta], &a[1], pParse->nBlob - (i+1));
    }else{
      memmove(&a[1], &a[1-delta], pParse->nBlob - (i+1-delta));
    }
    pParse->nBlob = newSize;
  }
  if( nNeeded==0 ){
    a[0] = (a[0] & 0x0f) | (szPayload<<4);
  }else if( nNeeded==1 ){
    a[0] = (a[0] & 0x0f) | 0xc0;
    a[1] = szPayload & 0xff;
  }else if( nNeeded==2 ){
    a[0] = (a[0] & 0x0f) | 0xd0;
    a[1] = (szPayload >> 8) & 0xff;
    a[2] = szPayload & 0xff;
  }else{
    a[0] = (a[0] & 0x0f) | 0xe0;
    a[1] = (szPayload >> 24) & 0xff;
    a[2] = (szPayload >> 16) & 0xff;
    a[3] = (szPayload >> 8) & 0xff;
    a[4] = szPayload & 0xff;
  }
  return delta;
}